

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O3

int wally_confidential_addr_to_addr(char *address,uint32_t prefix,char **output)

{
  int iVar1;
  size_t written;
  uchar buf [59];
  size_t local_60;
  byte local_58;
  uchar local_57;
  uchar local_36 [30];
  
  iVar1 = -2;
  if ((output != (char **)0x0) && (*output = (char *)0x0, address != (char *)0x0)) {
    iVar1 = wally_base58_to_bytes(address,1,&local_58,0x3b,&local_60);
    if ((iVar1 == 0) && ((iVar1 = -2, local_60 == 0x37 && (local_58 == prefix)))) {
      local_36[0] = local_57;
      iVar1 = wally_base58_from_bytes(local_36,0x15,1,output);
    }
    wally_clear(&local_58,0x3b);
  }
  return iVar1;
}

Assistant:

int wally_confidential_addr_to_addr(
    const char *address,
    uint32_t prefix,
    char **output)
{
    unsigned char buf[2 + EC_PUBLIC_KEY_LEN + HASH160_LEN + BASE58_CHECKSUM_LEN];
    unsigned char *addr_bytes_p = &buf[EC_PUBLIC_KEY_LEN + 1];
    size_t written;
    int ret;

    if (output)
        *output = NULL;

    if (!address || !output)
        return WALLY_EINVAL;

    ret = wally_base58_to_bytes(address, BASE58_FLAG_CHECKSUM, buf, sizeof(buf), &written);
    if (ret == WALLY_OK) {
        if (written != sizeof(buf) - BASE58_CHECKSUM_LEN || buf[0] != prefix)
            ret = WALLY_EINVAL;
        else {
            /* Move the version in front of the address hash and encode it */
            addr_bytes_p[0] = buf[1];
            ret = wally_base58_from_bytes(addr_bytes_p, HASH160_LEN + 1,
                                          BASE58_FLAG_CHECKSUM, output);
        }
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}